

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O0

void __thiscall bloaty::Regex::Clear(Regex *this)

{
  uint uVar1;
  long in_RDI;
  uint32 cached_has_bits;
  
  uVar1 = *(uint *)(in_RDI + 0x10);
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmptyNoArena
                ((ArenaStringPtr *)0x1c8593);
    }
    if ((uVar1 & 2) != 0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmptyNoArena
                ((ArenaStringPtr *)0x1c85ad);
    }
  }
  memset((void *)(in_RDI + 0x10),0,4);
  if (((uint)(((InternalMetadataWithArena *)(in_RDI + 8))->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    google::protobuf::internal::InternalMetadataWithArena::DoClear
              ((InternalMetadataWithArena *)(in_RDI + 8));
  }
  return;
}

Assistant:

void Regex::Clear() {
// @@protoc_insertion_point(message_clear_start:bloaty.Regex)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      pattern_.ClearNonDefaultToEmptyNoArena();
    }
    if (cached_has_bits & 0x00000002u) {
      replacement_.ClearNonDefaultToEmptyNoArena();
    }
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}